

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_alphamapblit_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  uchar *puVar4;
  quint32 *dest_00;
  quint32 *pqVar5;
  QRgba64 *in_RCX;
  int in_EDX;
  int in_ESI;
  QRasterBuffer *in_RDI;
  int in_R9D;
  long in_FS_OFFSET;
  int end;
  int start;
  QT_FT_Span *clip_1;
  long in_stack_00000018;
  int i;
  quint32 *dest_1;
  ClipLine *line;
  int yp;
  int top;
  int bottom;
  quint32 *dest;
  QColorTrcLut *colorProfile;
  int destStride;
  quint32 c;
  QRgba64 in_stack_00000078;
  QRgba64 srcColor;
  QColorTrcLut *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  quint32 in_stack_ffffffffffffff54;
  quint32 c_00;
  quint32 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar6;
  undefined8 in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  int local_84;
  QColorTrcLut *local_70;
  undefined3 in_stack_ffffffffffffffa0;
  uint uVar7;
  int local_3c;
  int local_38 [3];
  int local_2c;
  quint64 local_28;
  quint64 local_20;
  quint64 local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = CONCAT13(dest_1._0_1_,in_stack_ffffffffffffffa0) & 0x1ffffff;
  local_10 = in_EDX;
  local_c = in_ESI;
  QRgba64::toArgb32(in_RCX);
  QRasterBuffer::stride<unsigned_int>(in_RDI);
  bVar2 = QRgba64::isTransparent(in_RCX);
  if (!bVar2) {
    local_70 = (QColorTrcLut *)0x0;
    if ((uVar7 & 0x1000000) != 0) {
      QGuiApplicationPrivate::instance();
      local_70 = QGuiApplicationPrivate::colorProfileForA8Text((QGuiApplicationPrivate *)0xb45571);
    }
    local_18 = in_RCX->rgba;
    if ((local_70 != (QColorTrcLut *)0x0) && (bVar2 = QRgba64::isOpaque(in_RCX), bVar2)) {
      local_28 = local_18;
      local_20 = (quint64)QColorTrcLut::toLinear
                                    ((QColorTrcLut *)
                                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                     in_stack_00000078);
      local_18 = local_20;
    }
    if (in_stack_00000018 == 0) {
      QRasterBuffer::scanLine(in_RDI,local_10);
      while (end = end + -1, -1 < end) {
        qt_alphamapblit_argb32_oneline
                  (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                   (QRgba64 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      }
    }
    else {
      local_2c = local_10 + end;
      local_38[2] = QRasterBuffer::height(in_RDI);
      piVar3 = qMin<int>(&local_2c,local_38 + 2);
      iVar1 = *piVar3;
      local_38[1] = 0;
      piVar3 = qMax<int>(&local_10,local_38 + 1);
      local_84 = *piVar3;
      QClipData::initialize((QClipData *)CONCAT44(in_R9D,uVar7));
      for (; local_84 < iVar1; local_84 = local_84 + 1) {
        piVar3 = (int *)(*(long *)(in_stack_00000018 + 8) + (long)local_84 * 0x10);
        puVar4 = QRasterBuffer::scanLine(in_RDI,local_84);
        for (iVar6 = 0; iVar6 < *piVar3; iVar6 = iVar6 + 1) {
          dest_00 = (quint32 *)(*(long *)(piVar3 + 2) + (long)iVar6 * 0x10);
          pqVar5 = (quint32 *)qMax<int>(&local_c,(int *)dest_00);
          c_00 = *pqVar5;
          local_38[0] = local_c + in_R9D;
          local_3c = *dest_00 + dest_00[1];
          qMin<int>(local_38,&local_3c);
          qt_alphamapblit_argb32_oneline
                    ((uchar *)piVar3,(int)((ulong)puVar4 >> 0x20),
                     (QRgba64 *)CONCAT44(iVar6,in_stack_ffffffffffffff60),dest_00,c_00,
                     in_stack_ffffffffffffff48);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride,
                                   const QClipData *clip, bool useGammaCorrection)
{
    const quint32 c = color.toArgb32();
    const int destStride = rasterBuffer->stride<quint32>();

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    if (!clip) {
        quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y)) + x;
        while (--mapHeight >= 0) {
            qt_alphamapblit_argb32_oneline(map, mapWidth, srcColor, dest, c, colorProfile);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint32 *dest = reinterpret_cast<quint32 *>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];
                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                qt_alphamapblit_argb32_oneline(map + start - x, end - start, srcColor, dest + start, c, colorProfile);
            } // for (yp -> bottom)
            map += mapStride;
        }
    }
}